

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cc
# Opt level: O0

void __thiscall
gss::innards::Proof::create_adjacency_constraint
          (Proof *this,int p,int q,int t,vector<int,_std::allocator<int>_> *uu,
          vector<int,_std::allocator<int>_> *cancel,bool param_7)

{
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> __last;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> __last_00;
  bool bVar1;
  pointer pIVar2;
  ostream *poVar3;
  mapped_type *pmVar4;
  undefined8 in_R8;
  pair<std::_Rb_tree_iterator<std::pair<const_std::tuple<long,_long,_long,_long>,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_bool>
  pVar5;
  byte in_stack_00000008;
  long n_1;
  int *u_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<int,_std::allocator<int>_> *__range2_1;
  stringstream adjacency_constraint_to_recover;
  stringstream adjacency_constraint_for_opb;
  long n;
  int *u;
  const_iterator __end2;
  const_iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  stringstream adjacency_constraint;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff7c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff7d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  tuple<int,_int,_int,_int> *in_stack_fffffffffffff7d8;
  tuple<int,_int,_int,_int> *__args;
  undefined7 in_stack_fffffffffffff7e0;
  undefined1 in_stack_fffffffffffff7e7;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffff7e8;
  key_type *in_stack_fffffffffffff808;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffff810;
  string local_730 [32];
  _Base_ptr local_710;
  undefined1 local_708;
  undefined4 local_6dc;
  tuple<int,_int,_int,_int> local_6d8 [3];
  undefined4 local_6a4;
  long local_690;
  pair<int,_int> local_688;
  pair<long,_long> local_680;
  int *local_670;
  int *local_668;
  int *local_660;
  int *local_658;
  pair<int,_int> local_650;
  pair<long,_long> local_648;
  reference local_638;
  int *local_630;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_628;
  undefined8 local_620;
  pair<int,_int> local_618;
  pair<long,_long> local_610;
  pair<int,_int> local_600;
  pair<long,_long> local_5f8;
  stringstream local_5e8 [16];
  ostream local_5d8 [376];
  stringstream local_460 [16];
  ostream local_450 [376];
  string local_2d8 [32];
  _Base_ptr local_2b8;
  undefined1 local_2b0;
  undefined4 local_254;
  long local_240;
  pair<int,_int> local_238;
  pair<long,_long> local_230;
  int *local_220;
  int *local_218;
  int *local_210;
  int *local_208;
  reference local_200;
  int *local_1f8;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_1f0;
  undefined8 local_1e8;
  pair<int,_int> local_1e0;
  pair<long,_long> local_1d8 [2];
  stringstream local_1b8 [16];
  ostream local_1a8 [383];
  byte local_29;
  undefined8 local_20;
  int local_14;
  int local_10;
  int local_c [3];
  
  local_29 = in_stack_00000008 & 1;
  local_20 = in_R8;
  pIVar2 = std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
           ::operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                         *)0x19c639);
  if ((pIVar2->recover_encoding & 1U) == 0) {
    std::__cxx11::stringstream::stringstream(local_1b8);
    poVar3 = std::operator<<(local_1a8,"1 ~x");
    std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
    operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                *)0x19c67e);
    std::pair<int,_int>::pair<int_&,_int_&,_true>(&local_1e0,local_c,&local_14);
    std::pair<long,_long>::pair<int,_int,_true>(local_1d8,&local_1e0);
    pmVar4 = std::
             map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)in_stack_fffffffffffff810._M_current,in_stack_fffffffffffff808);
    std::operator<<(poVar3,(string *)pmVar4);
    local_1e8 = local_20;
    local_1f0._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin
                          ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff7c8);
    local_1f8 = (int *)std::vector<int,_std::allocator<int>_>::end
                                 ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff7c8);
    while (bVar1 = __gnu_cxx::operator==<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                             ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                               *)in_stack_fffffffffffff7d0,
                              (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                               *)in_stack_fffffffffffff7c8), ((bVar1 ^ 0xffU) & 1) != 0) {
      local_200 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                  ::operator*(&local_1f0);
      local_208 = (int *)std::vector<int,_std::allocator<int>_>::end
                                   ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff7c8);
      local_218 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                   ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff7c8);
      local_220 = (int *)std::vector<int,_std::allocator<int>_>::end
                                   ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff7c8);
      __last._M_current._7_1_ = in_stack_fffffffffffff7e7;
      __last._M_current._0_7_ = in_stack_fffffffffffff7e0;
      local_210 = (int *)std::
                         find<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,int>
                                   (in_stack_fffffffffffff7e8,__last,
                                    (int *)in_stack_fffffffffffff7d8);
      bVar1 = __gnu_cxx::operator==<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                        ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         in_stack_fffffffffffff7d0,
                         (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         in_stack_fffffffffffff7c8);
      if (bVar1) {
        poVar3 = std::operator<<(local_1a8," 1 x");
        std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
        operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                    *)0x19c826);
        std::pair<int,_int>::pair<int_&,_true>(&local_238,&local_10,local_200);
        std::pair<long,_long>::pair<int,_int,_true>(&local_230,&local_238);
        pmVar4 = std::
                 map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[]((map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffff810._M_current,in_stack_fffffffffffff808);
        std::operator<<(poVar3,(string *)pmVar4);
      }
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&local_1f0);
    }
    std::operator<<(local_1a8," >= 1");
    pIVar2 = std::
             unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
             operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                         *)0x19c8f2);
    local_240 = pIVar2->nb_constraints + 1;
    pIVar2->nb_constraints = local_240;
    std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
    operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                *)0x19c91b);
    local_254 = 0;
    std::tuple<int,_int,_int,_int>::tuple<int,_int_&,_int_&,_int_&,_true,_true>
              ((tuple<int,_int,_int,_int> *)
               CONCAT17(in_stack_fffffffffffff7e7,in_stack_fffffffffffff7e0),
               (int *)in_stack_fffffffffffff7d8,(int *)in_stack_fffffffffffff7d0,
               (int *)in_stack_fffffffffffff7c8,(int *)0x19c961);
    std::__cxx11::stringstream::str();
    std::
    tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    tuple<long_&,_long_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
              ((tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)CONCAT17(in_stack_fffffffffffff7e7,in_stack_fffffffffffff7e0),
               (long *)in_stack_fffffffffffff7d8,(long *)in_stack_fffffffffffff7d0,
               in_stack_fffffffffffff7c8);
    pVar5 = std::
            map<std::tuple<long,long,long,long>,std::tuple<long,long,std::__cxx11::string>,std::less<std::tuple<long,long,long,long>>,std::allocator<std::pair<std::tuple<long,long,long,long>const,std::tuple<long,long,std::__cxx11::string>>>>
            ::emplace<std::tuple<int,int,int,int>,std::tuple<long,long,std::__cxx11::string>>
                      ((map<std::tuple<long,_long,_long,_long>,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::tuple<long,_long,_long,_long>_>,_std::allocator<std::pair<const_std::tuple<long,_long,_long,_long>,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)CONCAT17(in_stack_fffffffffffff7e7,in_stack_fffffffffffff7e0),
                       in_stack_fffffffffffff7d8,
                       (tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_fffffffffffff7d0);
    local_2b8 = (_Base_ptr)pVar5.first._M_node;
    local_2b0 = pVar5.second;
    std::
    tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~tuple((tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x19c9f9);
    std::__cxx11::string::~string(in_stack_fffffffffffff7d0);
    pIVar2 = std::
             unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
             operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                         *)0x19ca13);
    std::__cxx11::stringstream::str();
    poVar3 = std::operator<<((ostream *)&pIVar2->field_0x50,local_2d8);
    std::operator<<(poVar3," ;\n");
    std::__cxx11::string::~string(in_stack_fffffffffffff7d0);
    std::__cxx11::stringstream::~stringstream(local_1b8);
  }
  else {
    std::__cxx11::stringstream::stringstream(local_460);
    std::__cxx11::stringstream::stringstream(local_5e8);
    poVar3 = std::operator<<(local_450,"1 ~x");
    std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
    operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                *)0x19cb34);
    std::pair<int,_int>::pair<int_&,_int_&,_true>(&local_600,local_c,&local_14);
    std::pair<long,_long>::pair<int,_int,_true>(&local_5f8,&local_600);
    pmVar4 = std::
             map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)in_stack_fffffffffffff810._M_current,in_stack_fffffffffffff808);
    std::operator<<(poVar3,(string *)pmVar4);
    poVar3 = std::operator<<(local_5d8,"1 ~x");
    std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
    operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                *)0x19cbd6);
    std::pair<int,_int>::pair<int_&,_int_&,_true>(&local_618,local_c,&local_14);
    std::pair<long,_long>::pair<int,_int,_true>(&local_610,&local_618);
    pmVar4 = std::
             map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)in_stack_fffffffffffff810._M_current,in_stack_fffffffffffff808);
    std::operator<<(poVar3,(string *)pmVar4);
    local_620 = local_20;
    local_628._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin
                          ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff7c8);
    local_630 = (int *)std::vector<int,_std::allocator<int>_>::end
                                 ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff7c8);
    while (bVar1 = __gnu_cxx::operator==<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                             ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                               *)in_stack_fffffffffffff7d0,
                              (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                               *)in_stack_fffffffffffff7c8), ((bVar1 ^ 0xffU) & 1) != 0) {
      local_638 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                  ::operator*(&local_628);
      poVar3 = std::operator<<(local_450," 1 x");
      std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
      operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                  *)0x19ccd8);
      std::pair<int,_int>::pair<int_&,_true>(&local_650,&local_10,local_638);
      std::pair<long,_long>::pair<int,_int,_true>(&local_648,&local_650);
      pmVar4 = std::
               map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_fffffffffffff810._M_current,in_stack_fffffffffffff808);
      std::operator<<(poVar3,(string *)pmVar4);
      local_658 = (int *)std::vector<int,_std::allocator<int>_>::end
                                   ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff7c8);
      local_668 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                   ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff7c8);
      local_670 = (int *)std::vector<int,_std::allocator<int>_>::end
                                   ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff7c8);
      __last_00._M_current._7_1_ = in_stack_fffffffffffff7e7;
      __last_00._M_current._0_7_ = in_stack_fffffffffffff7e0;
      in_stack_fffffffffffff810 =
           std::
           find<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,int>
                     (in_stack_fffffffffffff7e8,__last_00,(int *)in_stack_fffffffffffff7d8);
      local_660 = in_stack_fffffffffffff810._M_current;
      bVar1 = __gnu_cxx::operator==<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                        ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         in_stack_fffffffffffff7d0,
                         (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         in_stack_fffffffffffff7c8);
      if (bVar1) {
        in_stack_fffffffffffff808 = (key_type *)std::operator<<(local_5d8," 1 x");
        std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
        operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                    *)0x19cdf9);
        std::pair<int,_int>::pair<int_&,_true>(&local_688,&local_10,local_638);
        std::pair<long,_long>::pair<int,_int,_true>(&local_680,&local_688);
        pmVar4 = std::
                 map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[]((map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffff810._M_current,in_stack_fffffffffffff808);
        std::operator<<((ostream *)in_stack_fffffffffffff808,(string *)pmVar4);
      }
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&local_628);
    }
    std::operator<<(local_450," >= 1");
    std::operator<<(local_5d8," >= 1");
    pIVar2 = std::
             unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
             operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                         *)0x19cee5);
    local_690 = pIVar2->nb_constraints + 1;
    pIVar2->nb_constraints = local_690;
    std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
    operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                *)0x19cf0e);
    local_6a4 = 0;
    std::tuple<int,_int,_int,_int>::tuple<int,_int_&,_int_&,_int_&,_true,_true>
              ((tuple<int,_int,_int,_int> *)
               CONCAT17(in_stack_fffffffffffff7e7,in_stack_fffffffffffff7e0),
               (int *)in_stack_fffffffffffff7d8,(int *)in_stack_fffffffffffff7d0,
               (int *)in_stack_fffffffffffff7c8,(int *)0x19cf51);
    local_6dc = 0;
    std::__cxx11::stringstream::str();
    __args = local_6d8;
    std::
    tuple<long,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    tuple<long_&,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
              ((tuple<long,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)CONCAT17(in_stack_fffffffffffff7e7,in_stack_fffffffffffff7e0),(long *)__args,
               (int *)in_stack_fffffffffffff7d0,in_stack_fffffffffffff7c8);
    pVar5 = std::
            map<std::tuple<long,long,long,long>,std::tuple<long,long,std::__cxx11::string>,std::less<std::tuple<long,long,long,long>>,std::allocator<std::pair<std::tuple<long,long,long,long>const,std::tuple<long,long,std::__cxx11::string>>>>
            ::emplace<std::tuple<int,int,int,int>,std::tuple<long,int,std::__cxx11::string>>
                      ((map<std::tuple<long,_long,_long,_long>,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::tuple<long,_long,_long,_long>_>,_std::allocator<std::pair<const_std::tuple<long,_long,_long,_long>,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)CONCAT17(in_stack_fffffffffffff7e7,in_stack_fffffffffffff7e0),__args,
                       (tuple<long,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_fffffffffffff7d0);
    local_710 = (_Base_ptr)pVar5.first._M_node;
    local_708 = pVar5.second;
    std::
    tuple<long,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~tuple((tuple<long,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x19cfe4);
    std::__cxx11::string::~string(in_stack_fffffffffffff7d0);
    pIVar2 = std::
             unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
             operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                         *)0x19cffe);
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              &pIVar2->field_0x50;
    std::__cxx11::stringstream::str();
    poVar3 = std::operator<<((ostream *)this_00,local_730);
    std::operator<<(poVar3," ;\n");
    std::__cxx11::string::~string(this_00);
    std::__cxx11::stringstream::~stringstream(local_5e8);
    std::__cxx11::stringstream::~stringstream(local_460);
  }
  return;
}

Assistant:

auto Proof::create_adjacency_constraint(int p, int q, int t, const vector<int> & uu, const vector<int> & cancel,
        bool) -> void
{
    if (! _imp->recover_encoding) {
        stringstream adjacency_constraint;
        adjacency_constraint << "1 ~x" << _imp->variable_mappings[pair{p, t}];
        for (auto & u : uu)
            if (cancel.end() == find(cancel.begin(), cancel.end(), u))
                adjacency_constraint << " 1 x" << _imp->variable_mappings[pair{q, u}];
        adjacency_constraint << " >= 1";
        long n = ++_imp->nb_constraints;
        _imp->adjacency_lines.emplace(tuple{0, p, q, t}, tuple{n, n, adjacency_constraint.str()});
        _imp->model_stream << adjacency_constraint.str() << " ;\n";
    }
    else {
        stringstream adjacency_constraint_for_opb, adjacency_constraint_to_recover;
        adjacency_constraint_for_opb << "1 ~x" << _imp->variable_mappings[pair{p, t}];
        adjacency_constraint_to_recover << "1 ~x" << _imp->variable_mappings[pair{p, t}];
        for (auto & u : uu) {
            adjacency_constraint_for_opb << " 1 x" << _imp->variable_mappings[pair{q, u}];
            if (cancel.end() == find(cancel.begin(), cancel.end(), u))
                adjacency_constraint_to_recover << " 1 x" << _imp->variable_mappings[pair{q, u}];
        }
        adjacency_constraint_for_opb << " >= 1";
        adjacency_constraint_to_recover << " >= 1";

        long n = ++_imp->nb_constraints;
        _imp->adjacency_lines.emplace(tuple{0, p, q, t}, tuple{n, 0, adjacency_constraint_to_recover.str()});
        _imp->model_stream << adjacency_constraint_for_opb.str() << " ;\n";
    }
}